

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroid_test.cpp
# Opt level: O1

void __thiscall FIND_CountsAll_Test::TestBody(FIND_CountsAll_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *message;
  int iVar4;
  undefined1 local_70 [8];
  Graph G;
  internal local_50 [8];
  AssertionResult gtest_ar;
  int local_34 [2];
  int size;
  
  local_34[0] = 100;
  iVar4 = 0x32;
  this_00 = &gtest_ar.message_;
  this_01 = &G.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    iVar3 = local_34[0];
    iVar2 = rand();
    gen_tree((Graph *)local_70,iVar3,iVar2 % 5);
    iVar3 = rand();
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _find_centroid((Graph *)local_70,iVar3 % local_34[0],-1,0);
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"_find_centroid(G, rand() % size, -1, 0).first","size",(int *)this_00,
               local_34);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/centroid_test.cpp"
                 ,0x3d,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((Graph *)local_70);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

TEST(FIND, CountsAll) {
	int runs = 50, size = 100;
	rep(i, 0, runs) {
		Graph G = gen_tree(size);
		EXPECT_EQ(_find_centroid(G, rand() % size, -1, 0).first, size);
	}
}